

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

int __thiscall
slang::parsing::Token::clone(Token *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Info *__dest;
  Info *pIVar1;
  size_t __n;
  Token result;
  Token local_38;
  
  local_38.numFlags.raw = '\0';
  local_38.rawLen = 0;
  local_38.info = (Info *)0x0;
  init(&local_38,(EVP_PKEY_CTX *)__fn);
  local_38._2_1_ = local_38._2_1_ & 0xfe | this->field_0x2 & 1;
  __dest = local_38.info + 1;
  pIVar1 = this->info;
  __n = getExtraSize(this->kind);
  memcpy(__dest,pIVar1 + 1,__n);
  return CONCAT13((this->numFlags).raw,CONCAT12(local_38._2_1_,local_38.kind));
}

Assistant:

Token Token::clone(BumpAllocator& alloc, std::span<Trivia const> trivia, std::string_view rawText,
                   SourceLocation location) const {
    Token result(alloc, kind, trivia, rawText, location);
    result.missing = missing;

    memcpy(result.info->extra(), info->extra(), getExtraSize(kind));
    memcpy(&result.numFlags, &numFlags, 1);

    return result;
}